

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O3

void __thiscall
cppcms::url_dispatcher::assign_generic(url_dispatcher *this,string *expr,rhandler *h)

{
  _data *p_Var1;
  pointer pcVar2;
  undefined1 *puVar3;
  option *this_00;
  regex arStack_a8 [8];
  value_type local_a0;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  _Any_data local_70;
  code *local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  p_Var1 = (this->d).ptr_;
  local_90 = local_80;
  pcVar2 = (expr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + expr->_M_string_length);
  puVar3 = local_90;
  this_00 = (option *)operator_new(0xa0);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,puVar3,puVar3 + local_88);
  std::function<void_(const_booster::match_results<const_char_*>_&)>::function
            ((function<void_(const_booster::match_results<const_char_*>_&)> *)&local_70,h);
  booster::regex::regex(arStack_a8,(string *)local_50,0);
  anon_unknown_0::option::option(this_00,arStack_a8);
  booster::regex::~regex(arStack_a8);
  this_00->_vptr_option = (_func_int **)&PTR__base_handler_00285e30;
  std::function<void_(const_booster::match_results<const_char_*>_&)>::function
            ((function<void_(const_booster::match_results<const_char_*>_&)> *)
             &this_00[1].match_.end_,
             (function<void_(const_booster::match_results<const_char_*>_&)> *)&local_70);
  this_00[1]._vptr_option = (_func_int **)0x0;
  *(undefined8 *)&this_00[1].expr_ = 0;
  this_00[1].match_.begin_ = (char *)0x0;
  local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00285e70;
  local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this_00;
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back(&p_Var1->options,&local_a0);
  if (local_a0.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.
               super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void url_dispatcher::assign_generic(std::string const &expr,rhandler h)
	{
		d->options.push_back(make_handler(expr,h));
	}